

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

EnumValueOptions * __thiscall
google::protobuf::Arena::DoCreateMessage<google::protobuf::EnumValueOptions>(Arena *this)

{
  EnumValueOptions *this_00;
  
  this_00 = (EnumValueOptions *)
            AllocateAlignedWithHook(this,0x50,(type_info *)&EnumValueOptions::typeinfo);
  EnumValueOptions::EnumValueOptions(this_00,this,false);
  return this_00;
}

Assistant:

PROTOBUF_NDEBUG_INLINE T* DoCreateMessage(Args&&... args) {
    return InternalHelper<T>::Construct(
        AllocateInternal(sizeof(T), alignof(T),
                         internal::ObjectDestructor<
                             InternalHelper<T>::is_destructor_skippable::value,
                             T>::destructor,
                         RTTI_TYPE_ID(T)),
        this, std::forward<Args>(args)...);
  }